

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O0

string * cmWrap<cmGraphEdgeList>
                   (string *__return_storage_ptr__,string *prefix,cmGraphEdgeList *r,string *suffix,
                   string *sep)

{
  string *r_00;
  cmGraphEdgeList *__lhs;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  string *sep_local;
  string *suffix_local;
  cmGraphEdgeList *r_local;
  string *prefix_local;
  
  local_30 = sep;
  sep_local = suffix;
  suffix_local = (string *)r;
  r_local = (cmGraphEdgeList *)prefix;
  prefix_local = __return_storage_ptr__;
  bVar1 = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::empty
                    (&r->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>);
  __lhs = r_local;
  r_00 = suffix_local;
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::operator+(&local_b0,sep_local,local_30);
    std::operator+(&local_90,&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)r_local);
    cmJoin<cmGraphEdgeList>(&local_70,(cmGraphEdgeList *)r_00,&local_90);
    std::operator+(&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   &local_70);
    std::operator+(__return_storage_ptr__,&local_50,sep_local);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmWrap(std::string const& prefix, Range const& r,
                   std::string const& suffix, std::string const& sep)
{
  if (r.empty()) {
    return std::string();
  }
  return prefix + cmJoin(r, suffix + sep + prefix) + suffix;
}